

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O1

Arbiter * apollonia::Collide(PolygonBody *pa,PolygonBody *pb)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vec2 VVar4;
  Vec2 VVar5;
  bool bVar6;
  Vec2 VVar7;
  size_t sVar8;
  Arbiter *this;
  pointer pVVar9;
  uint uVar10;
  uint uVar11;
  PolygonBody *this_00;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  pointer pCVar15;
  Vec2 VVar16;
  Vec2 *pVVar17;
  size_t unaff_R12;
  size_t idx;
  size_t i;
  size_t sVar18;
  byte bVar19;
  Float FVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  initializer_list<apollonia::Contact> __l;
  Vec2 normal;
  size_t ia;
  size_t ib;
  ContactList contacts;
  ContactList clipped_contacts;
  Vec2 local_158;
  size_t local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_11c;
  size_t local_118;
  vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> local_110;
  undefined1 local_f8 [16];
  ContactList local_e8;
  Contact local_c8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined2 local_68;
  ulong local_60;
  ulong local_58;
  undefined8 local_4c;
  undefined4 local_44;
  
  bVar19 = 0;
  local_148 = PolygonBody::FindMinSeparatingAxis(pa,&local_150,pb);
  if ((0.0 <= local_148) ||
     (FVar20 = PolygonBody::FindMinSeparatingAxis(pb,&local_118,pa), sVar18 = local_150,
     0.0 <= FVar20)) {
    this = (Arbiter *)0x0;
  }
  else {
    this_00 = pa;
    if (local_148 < FVar20) {
      local_150 = local_118;
      local_118 = sVar18;
      this_00 = pb;
      pb = pa;
    }
    VVar16 = PolygonBody::EdgeAt(this_00,local_150);
    fVar22 = VVar16.x;
    local_148 = VVar16.y;
    fVar21 = local_148 * local_148 + fVar22 * fVar22;
    if (fVar21 < 0.0) {
      fStack_144 = local_148;
      fStack_140 = local_148;
      fStack_13c = local_148;
      local_138 = -fVar22;
      fStack_134 = -local_148;
      fStack_130 = -extraout_XMM0_Dc;
      fStack_12c = -extraout_XMM0_Dd;
      fVar21 = sqrtf(fVar21);
      fVar22 = local_138;
    }
    else {
      fVar21 = SQRT(fVar21);
      fVar22 = -fVar22;
    }
    local_158.y = fVar22 / fVar21;
    local_158.x = local_148 / fVar21;
    fVar22 = 3.4028235e+38;
    sVar18 = 0;
    do {
      local_148 = fVar22;
      VVar16 = PolygonBody::EdgeAt(pb,sVar18);
      fVar21 = VVar16.x;
      fVar22 = VVar16.y;
      fVar23 = fVar22 * fVar22 + fVar21 * fVar21;
      if (fVar23 < 0.0) {
        local_f8._8_4_ = extraout_XMM0_Dc_00;
        local_f8._0_4_ = VVar16.x;
        local_f8._4_4_ = VVar16.y;
        local_f8._12_4_ = extraout_XMM0_Dd_00;
        local_138 = fVar22;
        fStack_134 = fVar22;
        fStack_130 = fVar22;
        fStack_12c = fVar22;
        fVar23 = sqrtf(fVar23);
        fVar22 = local_138;
        fVar21 = (float)local_f8._0_4_;
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      fVar22 = (fVar22 / fVar23) * local_158.x + (-fVar21 / fVar23) * local_158.y;
      sVar8 = sVar18;
      if (local_148 <= fVar22) {
        fVar22 = local_148;
        sVar8 = unaff_R12;
      }
      unaff_R12 = sVar8;
      sVar18 = sVar18 + 1;
      pVVar9 = (pb->vertices_).super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_60 = (long)(pb->vertices_).
                       super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pVVar9 >> 3;
    } while (sVar18 < local_60);
    local_60 = (unaff_R12 + 1) % local_60;
    local_c8.pn = 0.0;
    local_c8.pt = 0.0;
    local_c8.bias = 0.0;
    local_c8.ra.x = 0.0;
    local_c8.ra.y = 0.0;
    local_c8.rb.x = 0.0;
    local_c8.rb.y = 0.0;
    local_c8.from_a._M_elems[0] = false;
    local_c8.from_a._M_elems[1] = false;
    fVar22 = (pb->super_Body).centroid_.x;
    fVar21 = (pb->super_Body).centroid_.y;
    fVar28 = pVVar9[unaff_R12].x - fVar22;
    fVar26 = pVVar9[unaff_R12].y - fVar21;
    fVar23 = (pb->super_Body).rotation_.mat_._M_elems[0].x;
    fVar25 = (pb->super_Body).rotation_.mat_._M_elems[0].y;
    fVar1 = (pb->super_Body).rotation_.mat_._M_elems[1].x;
    fVar24 = (pb->super_Body).rotation_.mat_._M_elems[1].y;
    fVar2 = (pb->super_Body).position_.x;
    fVar3 = (pb->super_Body).position_.y;
    local_c8.position.y = fVar28 * fVar1 + fVar26 * fVar24 + fVar21 + fVar3;
    local_c8.position.x = fVar23 * fVar28 + fVar26 * fVar25 + fVar22 + fVar2;
    local_4c = 0;
    local_44 = 0;
    uStack_78 = 0;
    local_70 = 0;
    local_68 = 0;
    fVar26 = pVVar9[local_60].x - fVar22;
    fVar28 = pVVar9[local_60].y - fVar21;
    local_80 = CONCAT44(fVar26 * fVar1 + fVar28 * fVar24 + fVar21 + fVar3,
                        fVar23 * fVar26 + fVar25 * fVar28 + fVar22 + fVar2);
    __l._M_len = 2;
    __l._M_array = &local_c8;
    local_c8.indices._M_elems[0] = unaff_R12;
    local_c8.indices._M_elems[1] = unaff_R12;
    local_58 = local_60;
    std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
              (&local_110,__l,(allocator_type *)&local_e8);
    std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
              ((vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&local_c8,
               &local_110);
    pVVar9 = (this_00->vertices_).
             super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)(this_00->vertices_).
                   super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pVVar9;
    if (lVar13 != 0) {
      uVar14 = lVar13 >> 3;
      this = (Arbiter *)0x0;
      uVar12 = 0;
      do {
        if (uVar12 != local_150) {
          fVar22 = (this_00->super_Body).centroid_.x;
          fVar21 = (this_00->super_Body).centroid_.y;
          fVar27 = pVVar9[uVar12].x - fVar22;
          fVar26 = pVVar9[uVar12].y - fVar21;
          fVar23 = (this_00->super_Body).rotation_.mat_._M_elems[0].x;
          fVar25 = (this_00->super_Body).rotation_.mat_._M_elems[0].y;
          fVar1 = (this_00->super_Body).rotation_.mat_._M_elems[1].x;
          fVar24 = (this_00->super_Body).rotation_.mat_._M_elems[1].y;
          fVar2 = (this_00->super_Body).position_.x;
          fVar28 = fVar23 * fVar27 + fVar26 * fVar25 + fVar22 + fVar2;
          fVar3 = (this_00->super_Body).position_.y;
          fVar26 = fVar27 * fVar1 + fVar26 * fVar24 + fVar21 + fVar3;
          uVar14 = (uVar12 + 1) % uVar14;
          fVar29 = pVVar9[uVar14].x - fVar22;
          fVar27 = pVVar9[uVar14].y - fVar21;
          fVar22 = (fVar23 * fVar29 + fVar25 * fVar27 + fVar22 + fVar2) - fVar28;
          fVar21 = (fVar29 * fVar1 + fVar27 * fVar24 + fVar21 + fVar3) - fVar26;
          fVar23 = fVar22 * fVar22 + fVar21 * fVar21;
          if (fVar23 < 0.0) {
            local_f8._0_4_ = fVar28;
            local_148 = fVar26;
            local_138 = fVar22;
            local_11c = fVar21;
            fVar23 = sqrtf(fVar23);
            fVar26 = local_148;
            fVar22 = local_138;
            fVar28 = (float)local_f8._0_4_;
            fVar21 = local_11c;
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          fVar24 = (((local_110.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start)->position).x - fVar28) *
                   (fVar21 / fVar23) -
                   (((local_110.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start)->position).y - fVar26) *
                   (fVar22 / fVar23);
          fVar25 = local_110.
                   super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].position.x;
          fVar1 = local_110.
                  super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                  _M_impl.super__Vector_impl_data._M_start[1].position.y;
          if (fVar24 <= 0.0) {
            pCVar15 = local_110.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            VVar16 = local_c8.position;
            for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
              *(Vec2 *)VVar16 = pCVar15->position;
              pCVar15 = (pointer)((long)pCVar15 + (ulong)bVar19 * -0x10 + 8);
              VVar16 = (Vec2)((Vec2 *)((long)VVar16 + 8) + (ulong)bVar19 * -2);
            }
            uVar10 = 1;
          }
          else {
            uVar10 = 0;
          }
          fVar22 = (fVar25 - fVar28) * (fVar21 / fVar23) - (fVar22 / fVar23) * (fVar1 - fVar26);
          uVar11 = uVar10;
          if (fVar22 <= 0.0) {
            uVar11 = uVar10 + 1;
            pCVar15 = local_110.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1;
            pVVar17 = (Vec2 *)((ulong)(uVar10 * 0x48) + (long)local_c8.position);
            for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
              *pVVar17 = pCVar15->position;
              pCVar15 = (pointer)((long)pCVar15 + (ulong)bVar19 * -0x10 + 8);
              pVVar17 = pVVar17 + (ulong)bVar19 * -2 + 1;
            }
          }
          if (fVar24 * fVar22 < 0.0) {
            fVar21 = (local_110.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].position.x * fVar24 -
                     ((local_110.
                       super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                       _M_impl.super__Vector_impl_data._M_start)->position).x * fVar22) /
                     (fVar24 - fVar22);
            if ((NAN(fVar21)) ||
               (fVar22 = (fVar24 * local_110.
                                   super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].position.y -
                         fVar22 * ((local_110.
                                    super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->position).y) /
                         (fVar24 - fVar22), NAN(fVar22))) {
              __assert_fail("!std::isnan(v.x) && !std::isnan(v.y)",
                            "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.cc"
                            ,0x28,
                            "size_t apollonia::Clip(Arbiter::ContactList &, const Arbiter::ContactList &, size_t, const Vec2 &, const Vec2 &)"
                           );
            }
            lVar13 = (ulong)(uVar11 * 8) * 9;
            *(ulong *)((long)local_c8.position + lVar13) = CONCAT44(fVar22,fVar21);
            *(undefined1 *)((long)((long)local_c8.position + 0x18) + lVar13) = 1;
            *(ulong *)((long)((array<unsigned_long,_2UL> *)((long)local_c8.position + 0x20))->
                             _M_elems + lVar13) = uVar12;
            uVar11 = uVar11 + 1;
          }
          if (2 < uVar11) {
            __assert_fail("num_out <= 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.cc"
                          ,0x2f,
                          "size_t apollonia::Clip(Arbiter::ContactList &, const Arbiter::ContactList &, size_t, const Vec2 &, const Vec2 &)"
                         );
          }
          if (uVar11 != 2) goto LAB_00110e17;
          std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::operator=
                    (&local_110,
                     (vector<apollonia::Contact,_std::allocator<apollonia::Contact>_> *)&local_c8);
        }
        uVar12 = uVar12 + 1;
        pVVar9 = (this_00->vertices_).
                 super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (long)(this_00->vertices_).
                       super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pVVar9 >> 3;
      } while (uVar12 < uVar14);
    }
    pVVar9 = (this_00->vertices_).
             super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar22 = (this_00->super_Body).centroid_.x;
    fVar21 = (this_00->super_Body).centroid_.y;
    fVar25 = pVVar9[local_150].x - fVar22;
    fVar23 = pVVar9[local_150].y - fVar21;
    local_138 = (this_00->super_Body).rotation_.mat_._M_elems[0].x * fVar25 +
                (this_00->super_Body).rotation_.mat_._M_elems[0].y * fVar23 + fVar22 +
                (this_00->super_Body).position_.x;
    local_148 = fVar25 * (this_00->super_Body).rotation_.mat_._M_elems[1].x +
                fVar23 * (this_00->super_Body).rotation_.mat_._M_elems[1].y + fVar21 +
                (this_00->super_Body).position_.y;
    local_e8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = World::NewArbiter(&this_00->super_Body,&pb->super_Body,&local_158,&local_e8);
    VVar16 = local_c8.position;
    VVar4 = local_c8.ra;
    if (local_e8.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      VVar16 = local_c8.position;
      VVar4 = local_c8.ra;
    }
    for (; VVar7 = local_c8.ra, bVar6 = VVar16 != local_c8.ra, local_c8.ra = VVar4, bVar6;
        VVar16 = (Vec2)((long)VVar16 + 0x48)) {
      fVar22 = *(float *)VVar16;
      fVar21 = *(Float *)((long)VVar16 + 4);
      fVar23 = (fVar22 - local_138) * local_158.x + (fVar21 - local_148) * local_158.y;
      if (fVar23 <= 0.0) {
        *(float *)((long)VVar16 + 0x30) = fVar23;
        VVar5.y = fVar21 - ((this_00->super_Body).position_.y + (this_00->super_Body).centroid_.y);
        VVar5.x = fVar22 - ((this_00->super_Body).position_.x + (this_00->super_Body).centroid_.x);
        *(Vec2 *)((long)VVar16 + 8) = VVar5;
        VVar4.y = fVar21 - ((pb->super_Body).position_.y + (pb->super_Body).centroid_.y);
        VVar4.x = fVar22 - ((pb->super_Body).position_.x + (pb->super_Body).centroid_.x);
        *(Vec2 *)((long)VVar16 + 0x10) = VVar4;
        Arbiter::AddContact(this,(Contact *)VVar16);
      }
      VVar4 = local_c8.ra;
      local_c8.ra = VVar7;
    }
LAB_00110e17:
    if (local_c8.position != (Vec2)0x0) {
      operator_delete((void *)local_c8.position,(long)local_c8.rb - (long)local_c8.position);
    }
    if (local_110.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.
                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_110.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.
                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return this;
}

Assistant:

Arbiter* Collide(PolygonBody* pa, PolygonBody* pb) {
  size_t ia, ib;
  Float sa, sb;
  if ((sa = pa->FindMinSeparatingAxis(ia, *pb)) >= 0) {
    return nullptr;
  }
  if ((sb = pb->FindMinSeparatingAxis(ib, *pa)) >= 0) {
    return nullptr;
  }
  if (sa < sb) {
    std::swap(sa, sb);
    std::swap(ia, ib);
    std::swap(pa, pb);
  }
  auto& a = *pa;
  auto& b = *pb;
  auto normal = a.EdgeAt(ia).Normal();
  auto idx = FindIncidentEdge(normal, b);
  auto next_idx = (idx + 1) % b.Count();
  Arbiter::ContactList contacts = {{b, idx}, {b, next_idx}};
  auto clipped_contacts = contacts;
  for (size_t i = 0; i < a.Count(); ++i) {
    if (i == ia) {
      continue;
    }
    auto v0 = a.LocalToWorld(a[i]);
    auto v1 = a.LocalToWorld(a[(i+1)%a.Count()]);
    auto num = Clip(clipped_contacts, contacts, i, v0, v1);
    if (num < 2) {
      return nullptr;
    }
    assert(num == 2);
    contacts = clipped_contacts;
  }

  auto va = a.LocalToWorld(a[ia]);
  auto arbiter = World::NewArbiter(a, b, normal);
  for (auto& contact : clipped_contacts) {
    auto sep = Dot(contact.position - va, normal);
    if (sep <= 0) {
      contact.separation = sep;
      contact.ra = contact.position - a.LocalToWorld(a.centroid());
      contact.rb = contact.position - b.LocalToWorld(b.centroid());
      arbiter->AddContact(contact);
    }
  }
  return arbiter;
}